

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

void duckdb::TestVectorFlat::Generate(TestVectorInfo *info)

{
  idx_t iVar1;
  pointer pDVar2;
  Allocator *allocator;
  reference this;
  Value *val;
  idx_t iVar3;
  long lVar4;
  idx_t i;
  idx_t index;
  ulong __n;
  ulong uVar5;
  templated_unique_single_t result;
  TestGeneratedValues result_values;
  
  GenerateValues(&result_values,info);
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    iVar1 = TestGeneratedValues::Rows(&result_values);
    if (iVar1 <= uVar5) break;
    make_uniq<duckdb::DataChunk>();
    pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&result.
                            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                       );
    allocator = Allocator::DefaultAllocator();
    DataChunk::Initialize(pDVar2,allocator,info->types,0x800);
    iVar1 = TestGeneratedValues::Rows(&result_values);
    iVar3 = iVar1 - uVar5;
    if (0x7ff < iVar3) {
      iVar3 = 0x800;
    }
    iVar1 = iVar1 + lVar4;
    if (0x7ff < iVar1) {
      iVar1 = 0x800;
    }
    for (__n = 0; __n < (ulong)(((long)(info->types->
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ).
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(info->types->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        __n = __n + 1) {
      for (index = 0; iVar1 != index; index = index + 1) {
        pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&result.
                                super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                           );
        this = vector<duckdb::Vector,_true>::get<true>(&pDVar2->data,__n);
        val = TestGeneratedValues::GetValue(&result_values,uVar5 + index,__n);
        Vector::SetValue(this,index,val);
      }
    }
    pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&result.
                            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                       );
    pDVar2->count = iVar3;
    ::std::
    vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)info->entries,
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               &result.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
    ;
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              (&result.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
    ;
    uVar5 = uVar5 + 0x800;
    lVar4 = lVar4 + -0x800;
  }
  ::std::
  vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ::~vector((vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
             *)&result_values);
  return;
}

Assistant:

static void Generate(TestVectorInfo &info) {
		auto result_values = GenerateValues(info);
		for (idx_t cur_row = 0; cur_row < result_values.Rows(); cur_row += STANDARD_VECTOR_SIZE) {
			auto result = make_uniq<DataChunk>();
			result->Initialize(Allocator::DefaultAllocator(), info.types);
			auto cardinality = MinValue<idx_t>(STANDARD_VECTOR_SIZE, result_values.Rows() - cur_row);
			for (idx_t c = 0; c < info.types.size(); c++) {
				for (idx_t i = 0; i < cardinality; i++) {
					result->data[c].SetValue(i, result_values.GetValue(cur_row + i, c));
				}
			}
			result->SetCardinality(cardinality);
			info.entries.push_back(std::move(result));
		}
	}